

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.hpp
# Opt level: O1

void __thiscall
deqp::ub::StructMember::StructMember(StructMember *this,char *name,VarType *type,deUint32 flags)

{
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name,&local_19);
  (this->m_type).m_type = TYPE_LAST;
  *(undefined8 *)&(this->m_type).m_flags = 0;
  *(undefined8 *)((long)&(this->m_type).m_data.array.elementType + 4) = 0;
  ub::VarType::operator=(&this->m_type,type);
  this->m_flags = flags;
  return;
}

Assistant:

StructMember(const char* name, const VarType& type, deUint32 flags) : m_name(name), m_type(type), m_flags(flags)
	{
	}